

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

uint * __thiscall ON_Mesh::GetVertexLocationIds(ON_Mesh *this,uint first_vid,uint *Vid,uint *Vindex)

{
  bool bVar1;
  uint *puVar2;
  ulong point_count;
  
  point_count = (ulong)(uint)(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  bVar1 = HasSynchronizedDoubleAndSinglePrecisionVertices(this);
  if (bVar1) {
    puVar2 = ON_GetPointLocationIds
                       (point_count,(this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a,first_vid,Vid,
                        Vindex);
    return puVar2;
  }
  puVar2 = ON_GetPointLocationIds
                     (point_count,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a,first_vid,Vid,
                      Vindex);
  return puVar2;
}

Assistant:

unsigned int* ON_Mesh::GetVertexLocationIds(
  unsigned int first_vid,
  unsigned int* Vid,
  unsigned int* Vindex
  ) const
{
  const unsigned int vertex_count = VertexUnsignedCount();
  return (HasSynchronizedDoubleAndSinglePrecisionVertices())
    ? ON_GetPointLocationIds(vertex_count, m_dV.Array(), first_vid, Vid, Vindex)
    : ON_GetPointLocationIds(vertex_count, m_V.Array(), first_vid, Vid, Vindex);
}